

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

int Pdr_ManCheckCube(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,Pdr_Set_t **ppPred,int nConfLimit)

{
  Pdr_Man_t *p_00;
  int iVar1;
  lit Entry;
  Aig_Obj_t *pObj;
  abctime aVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  Pdr_Set_t *pPVar7;
  abctime Limit;
  abctime clk;
  int RetValue;
  int Lit;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  int local_38;
  int fLitUsed;
  int fUseLit;
  int nConfLimit_local;
  Pdr_Set_t **ppPred_local;
  Pdr_Set_t *pCube_local;
  Pdr_Man_t *pPStack_18;
  int k_local;
  Pdr_Man_t *p_local;
  
  local_38 = 1;
  pSat._4_4_ = 0;
  p->nCalls = p->nCalls + 1;
  fLitUsed = nConfLimit;
  _fUseLit = ppPred;
  ppPred_local = (Pdr_Set_t **)pCube;
  pCube_local._4_4_ = k;
  pPStack_18 = p;
  vLits = (Vec_Int_t *)Pdr_ManFetchSolver(p,k);
  if (ppPred_local == (Pdr_Set_t **)0x0) {
    Limit = Abc_Clock();
    p_00 = pPStack_18;
    iVar1 = pCube_local._4_4_;
    pObj = Aig_ManCo(pPStack_18->pAig,pPStack_18->iOutCur);
    iVar1 = Pdr_ObjSatVar(p_00,iVar1,2,pObj);
    clk._4_4_ = toLit(iVar1);
    pVVar5 = vLits;
    aVar2 = Pdr_ManTimeLimit(pPStack_18);
    aVar2 = sat_solver_set_runtime_limit((sat_solver *)pVVar5,aVar2);
    clk._0_4_ = sat_solver_solve((sat_solver *)vLits,(lit *)((long)&clk + 4),&RetValue,
                                 (long)fLitUsed,0,0,0);
    sat_solver_set_runtime_limit((sat_solver *)vLits,aVar2);
    if ((int)clk == 0) {
      return -1;
    }
  }
  else {
    if (local_38 == 0) {
      _RetValue = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,0,1);
    }
    else {
      pSat._4_4_ = 1;
      Vec_IntAddToEntry(pPStack_18->vActVars,pCube_local._4_4_,1);
      _RetValue = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,1,0);
      iVar1 = Pdr_ManFreeVar(pPStack_18,pCube_local._4_4_);
      clk._4_4_ = toLit(iVar1);
      Vec_IntPush(_RetValue,clk._4_4_);
      pVVar5 = vLits;
      piVar3 = Vec_IntArray(_RetValue);
      piVar4 = Vec_IntArray(_RetValue);
      iVar1 = Vec_IntSize(_RetValue);
      clk._0_4_ = sat_solver_addclause((sat_solver *)pVVar5,piVar3,piVar4 + iVar1);
      if ((int)clk != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                      ,0x13f,
                      "int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int)");
      }
      sat_solver_compress((sat_solver *)vLits);
      pVVar5 = Pdr_ManCubeToLits(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local,0,1);
      _RetValue = pVVar5;
      Entry = lit_neg(clk._4_4_);
      Vec_IntPush(pVVar5,Entry);
    }
    Limit = Abc_Clock();
    pVVar5 = vLits;
    aVar2 = Pdr_ManTimeLimit(pPStack_18);
    aVar2 = sat_solver_set_runtime_limit((sat_solver *)pVVar5,aVar2);
    pVVar5 = vLits;
    piVar3 = Vec_IntArray(_RetValue);
    piVar4 = Vec_IntArray(_RetValue);
    iVar1 = Vec_IntSize(_RetValue);
    clk._0_4_ = sat_solver_solve((sat_solver *)pVVar5,piVar3,piVar4 + iVar1,(long)fLitUsed,0,0,0);
    sat_solver_set_runtime_limit((sat_solver *)vLits,aVar2);
    if ((int)clk == 0) {
      return -1;
    }
  }
  aVar2 = Abc_Clock();
  lVar6 = aVar2 - Limit;
  pPStack_18->tSat = lVar6 + pPStack_18->tSat;
  if ((int)clk != 0) {
    if ((int)clk == -1) {
      pPStack_18->tSatUnsat = lVar6 + pPStack_18->tSatUnsat;
      pPStack_18->nCallsU = pPStack_18->nCallsU + 1;
      if (_fUseLit != (Pdr_Set_t **)0x0) {
        *_fUseLit = (Pdr_Set_t *)0x0;
      }
      clk._0_4_ = 1;
    }
    else {
      pPStack_18->tSatSat = lVar6 + pPStack_18->tSatSat;
      pPStack_18->nCallsS = pPStack_18->nCallsS + 1;
      if (_fUseLit != (Pdr_Set_t **)0x0) {
        pPVar7 = Pdr_ManTernarySim(pPStack_18,pCube_local._4_4_,(Pdr_Set_t *)ppPred_local);
        *_fUseLit = pPVar7;
      }
      clk._0_4_ = 0;
    }
    return (int)clk;
  }
  __assert_fail("RetValue != l_Undef",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                ,0x165,"int Pdr_ManCheckCube(Pdr_Man_t *, int, Pdr_Set_t *, Pdr_Set_t **, int)");
}

Assistant:

int Pdr_ManCheckCube( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, Pdr_Set_t ** ppPred, int nConfLimit )
{ 
    int fUseLit = 1;
    int fLitUsed = 0;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int Lit, RetValue;
    abctime clk, Limit;
    p->nCalls++;
    pSat = Pdr_ManFetchSolver( p, k );
    if ( pCube == NULL ) // solve the property
    {
        clk = Abc_Clock();
        Lit = toLit( Pdr_ObjSatVar(p, k, 2, Aig_ManCo(p->pAig, p->iOutCur)) ); // pos literal (property fails)
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, &Lit, &Lit + 1, nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
    }
    else // check relative containment in terms of next states
    {
        if ( fUseLit )
        {
            fLitUsed = 1;
            Vec_IntAddToEntry( p->vActVars, k, 1 );
            // add the cube in terms of current state variables
            vLits = Pdr_ManCubeToLits( p, k, pCube, 1, 0 );
            // add activation literal
            Lit = toLit( Pdr_ManFreeVar(p, k) );
            // add activation literal
            Vec_IntPush( vLits, Lit );
            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            sat_solver_compress( pSat );
            // create assumptions
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );
            // add activation literal
            Vec_IntPush( vLits, lit_neg(Lit) );
        }
        else
            vLits = Pdr_ManCubeToLits( p, k, pCube, 0, 1 );

        // solve 
        clk = Abc_Clock();
        Limit = sat_solver_set_runtime_limit( pSat, Pdr_ManTimeLimit(p) );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nConfLimit, 0, 0, 0 );
        sat_solver_set_runtime_limit( pSat, Limit );
        if ( RetValue == l_Undef )
            return -1;
/*
        if ( RetValue == l_True )
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesSS++;
            else
                p->nCasesSU++;
        }
        else
        {
            int RetValue2 = Pdr_ManCubeJust( p, k, pCube );
            if ( RetValue2 )
                p->nCasesUS++;
            else
                p->nCasesUU++;
        }
*/
    }
    clk = Abc_Clock() - clk;
    p->tSat += clk;
    assert( RetValue != l_Undef );
    if ( RetValue == l_False )
    {
        p->tSatUnsat += clk;
        p->nCallsU++;
        if ( ppPred )
            *ppPred = NULL;
        RetValue = 1;
    }
    else // if ( RetValue == l_True )
    {
        p->tSatSat += clk;
        p->nCallsS++;
        if ( ppPred )
            *ppPred = Pdr_ManTernarySim( p, k, pCube );
        RetValue = 0;
    }

/* // for some reason, it does not work...
    if ( fLitUsed )
    {
        int RetValue;
        Lit = lit_neg(Lit);
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
        sat_solver_compress( pSat );
    }
*/
    return RetValue;
}